

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O1

sptr_t wal_write_mips(sptr_t buf,image_data_conflict *im,size_t mips,uint32_t *offsets)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  size_t n;
  uchar *puVar6;
  ulong uVar7;
  sptr_t sVar8;
  uchar *out;
  uchar *local_38;
  
  local_38 = buf.ptr;
  uVar1 = im->width;
  uVar2 = im->height;
  if (mips == 0) {
    n = 0;
  }
  else {
    sVar4 = 0;
    n = 0;
    do {
      offsets[sVar4] = (uint32_t)n;
      if (uVar2 != 0) {
        puVar6 = (im->pixels).ptr;
        lVar5 = (long)(1 << ((byte)sVar4 & 0x1f));
        uVar3 = 0;
        do {
          if (uVar1 != 0) {
            uVar7 = 0;
            do {
              write_8(puVar6[uVar7],&local_38);
              n = n + 1;
              uVar7 = uVar7 + lVar5;
            } while (uVar7 < uVar1);
          }
          uVar3 = uVar3 + lVar5;
          puVar6 = puVar6 + (ulong)uVar1 * lVar5;
        } while (uVar3 < uVar2);
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != mips);
  }
  sVar8 = sptr_advance(buf,n);
  return sVar8;
}

Assistant:

static sptr_t wal_write_mips(sptr_t buf, const struct image_data *im,
							 size_t mips, uint32_t *offsets)
{
	int mip_num, x, y;
	size_t bytes_written = 0, width = im->width, height = im->height;
	unsigned char *ptr = NULL;
	unsigned char *out = buf.ptr;
	for (mip_num = 0; mip_num < mips; mip_num++) {
		offsets[mip_num] = bytes_written;
		ptr = im->pixels.ptr;
		for (y = 0; y < height; y += 1 << mip_num) {
			for (x = 0; x < width; x += 1 << mip_num) {
				write_8(ptr[x + width * y], &out);
				bytes_written++;
			}
		}
	}
	return sptr_advance(buf, bytes_written);
}